

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr)

{
  TAG_NAME *tagNamePtr;
  undefined1 uVar1;
  int iVar2;
  XML_Error XVar3;
  long lVar4;
  code *pcVar5;
  undefined8 *puVar6;
  void *__dest;
  XML_Char *name;
  NAMED *pNVar7;
  char *pcVar8;
  undefined1 *puVar9;
  char cVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  XML_Char **ppXVar14;
  undefined8 uVar15;
  uint uVar16;
  BINDING *b;
  long *plVar17;
  char *pcVar18;
  long lVar19;
  undefined8 *puVar20;
  ulong uVar21;
  bool bVar22;
  char *s_local;
  char *next;
  char *local_a0;
  STRING_POOL *local_98;
  int local_8c;
  NAMED *local_88;
  undefined8 *local_80;
  char *fromPtr;
  undefined8 *local_70;
  XML_Char *toPtr;
  NAMED **ppNStack_60;
  undefined8 local_58;
  NAMED *local_50;
  uint local_44;
  HASH_TABLE *local_40;
  STRING_POOL *local_38;
  
  if (*(ENCODING **)((long)parser + 0x118) == enc) {
    puVar20 = (undefined8 *)((long)parser + 0x218);
    puVar6 = (undefined8 *)((long)parser + 0x220);
  }
  else {
    puVar20 = *(undefined8 **)((long)parser + 0x230);
    puVar6 = puVar20 + 1;
  }
  *puVar20 = s;
  local_98 = (STRING_POOL *)((long)parser + 0x418);
  local_38 = (STRING_POOL *)((long)parser + 0x330);
  local_40 = (HASH_TABLE *)((long)parser + 0x290);
  s_local = s;
  local_a0 = end;
  local_8c = startTagLevel;
  local_80 = puVar6;
  local_70 = puVar20;
  do {
    next = s_local;
    iVar2 = (*enc->scanners[1])(enc,s_local,local_a0,&next);
    *puVar6 = next;
    switch(iVar2) {
    case 0:
      *puVar20 = next;
      return XML_ERROR_INVALID_TOKEN;
    case 1:
      if ((*(long *)((long)parser + 0x68) == 0) &&
         (XVar3 = storeAtts(parser,enc,s_local,(TAG_NAME *)0x0,(BINDING **)0x0),
         XVar3 != XML_ERROR_NONE)) {
        return XVar3;
      }
    case 2:
      puVar6 = *(undefined8 **)((long)parser + 0x3d8);
      if (puVar6 == (undefined8 *)0x0) {
        puVar6 = (undefined8 *)(**(code **)((long)parser + 0x18))(0x48);
        if (puVar6 == (undefined8 *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        lVar11 = (**(code **)((long)parser + 0x18))(0x20);
        puVar6[6] = lVar11;
        if (lVar11 == 0) {
          return XML_ERROR_NO_MEMORY;
        }
        puVar6[7] = lVar11 + 0x20;
      }
      else {
        *(undefined8 *)((long)parser + 0x3d8) = *puVar6;
      }
      puVar6[8] = 0;
      *puVar6 = *(undefined8 *)((long)parser + 0x3d0);
      *(undefined8 **)((long)parser + 0x3d0) = puVar6;
      puVar6[4] = 0;
      iVar2 = enc->minBytesPerChar;
      puVar6[1] = s_local + iVar2;
      iVar2 = (*enc->nameLength)(enc,s_local + iVar2);
      *(int *)(puVar6 + 2) = iVar2;
      if (nextPtr != (char **)0x0) {
        __dest = (void *)puVar6[6];
        if (puVar6[7] - (long)__dest < (long)(iVar2 + 1)) {
          __dest = (void *)(**(code **)((long)parser + 0x20))(__dest,(long)(iVar2 << 2));
          puVar6[6] = __dest;
          if (__dest == (void *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          puVar6[7] = (long)(iVar2 << 2) + (long)__dest;
          iVar2 = *(int *)(puVar6 + 2);
        }
        memcpy(__dest,(void *)puVar6[1],(long)iVar2);
        puVar6[1] = puVar6[6];
      }
      *(int *)((long)parser + 0x23c) = *(int *)((long)parser + 0x23c) + 1;
      tagNamePtr = (TAG_NAME *)(puVar6 + 3);
      if (*(long *)((long)parser + 0x68) == 0) {
        tagNamePtr->str = (XML_Char *)0x0;
        lVar11 = *(long *)((long)parser + 0xa0);
        puVar6 = local_80;
joined_r0x0047e334:
        if (lVar11 != 0) {
LAB_0047e340:
          reportDefault(parser,enc,s_local,next);
        }
      }
      else {
        local_88 = (NAMED *)(puVar6 + 8);
        while( true ) {
          fromPtr = (char *)puVar6[1];
          lVar11 = (long)*(int *)(puVar6 + 2);
          pcVar18 = fromPtr + lVar11;
          if (nextPtr == (char **)0x0) {
            lVar11 = 0;
          }
          toPtr = (XML_Char *)(lVar11 + puVar6[6]);
          puVar6[3] = toPtr;
          (*enc->utf8Convert)(enc,&fromPtr,pcVar18,&toPtr,(char *)(puVar6[7] + -1));
          if (fromPtr == pcVar18) break;
          lVar19 = (long)((*(int *)(puVar6 + 7) - (int)puVar6[6]) * 2);
          lVar11 = (**(code **)((long)parser + 0x20))(puVar6[6],lVar19);
          puVar6[6] = lVar11;
          if (lVar11 == 0) {
            return XML_ERROR_NO_MEMORY;
          }
          puVar6[7] = lVar19 + lVar11;
          if (nextPtr != (char **)0x0) {
            puVar6[1] = lVar11;
          }
        }
        *toPtr = '\0';
        XVar3 = storeAtts(parser,enc,s_local,tagNamePtr,(BINDING **)local_88);
        if (XVar3 != XML_ERROR_NONE) {
          return XVar3;
        }
        (**(code **)((long)parser + 0x68))
                  (*(undefined8 *)((long)parser + 8),tagNamePtr->str,
                   *(undefined8 *)((long)parser + 0x400));
        poolClear(local_98);
        puVar6 = local_80;
        puVar20 = local_70;
      }
      break;
    case 3:
      if (*(long *)((long)parser + 0x68) == 0) {
        XVar3 = storeAtts(parser,enc,s_local,(TAG_NAME *)0x0,(BINDING **)0x0);
        if (XVar3 != XML_ERROR_NONE) {
          return XVar3;
        }
        goto switchD_0047db34_caseD_4;
      }
LAB_0047dcc0:
      pcVar18 = s_local + enc->minBytesPerChar;
      fromPtr = (char *)0x0;
      iVar2 = (*enc->nameLength)(enc,pcVar18);
      toPtr = poolStoreString(local_98,enc,pcVar18,pcVar18 + iVar2);
      if (toPtr == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
      XVar3 = storeAtts(parser,enc,s_local,(TAG_NAME *)&toPtr,(BINDING **)&fromPtr);
      if (XVar3 != XML_ERROR_NONE) {
        return XVar3;
      }
      *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
      if (*(code **)((long)parser + 0x68) != (code *)0x0) {
        (**(code **)((long)parser + 0x68))
                  (*(undefined8 *)((long)parser + 8),toPtr,*(undefined8 *)((long)parser + 0x400));
      }
      pcVar5 = *(code **)((long)parser + 0x70);
      if (pcVar5 != (code *)0x0) {
        if (*(long *)((long)parser + 0x68) != 0) {
          *puVar20 = *local_80;
          pcVar5 = *(code **)((long)parser + 0x70);
        }
        (*pcVar5)(*(undefined8 *)((long)parser + 8),toPtr);
      }
      poolClear(local_98);
      plVar17 = (long *)fromPtr;
      while (puVar6 = local_80, plVar17 != (long *)0x0) {
        if (*(code **)((long)parser + 0xd0) != (code *)0x0) {
          (**(code **)((long)parser + 0xd0))
                    (*(undefined8 *)((long)parser + 8),*(undefined8 *)*plVar17);
        }
        plVar12 = (long *)plVar17[1];
        plVar17[1] = *(long *)((long)parser + 1000);
        *(long **)((long)parser + 1000) = plVar17;
        *(long *)(*plVar17 + 8) = plVar17[2];
        plVar17 = plVar12;
      }
      goto LAB_0047dddc;
    case 4:
switchD_0047db34_caseD_4:
      if ((*(long *)((long)parser + 0x68) != 0) || (*(long *)((long)parser + 0x70) != 0))
      goto LAB_0047dcc0;
      if (*(long *)((long)parser + 0xa0) != 0) {
        reportDefault(parser,enc,s_local,next);
      }
LAB_0047dddc:
      iVar2 = *(int *)((long)parser + 0x23c);
joined_r0x0047e18b:
      if (iVar2 == 0) {
        XVar3 = epilogProcessor(parser,next,local_a0,nextPtr);
        return XVar3;
      }
      break;
    case 5:
      if (*(int *)((long)parser + 0x23c) != local_8c) {
        puVar6 = *(undefined8 **)((long)parser + 0x3d0);
        *(undefined8 *)((long)parser + 0x3d0) = *puVar6;
        *puVar6 = *(undefined8 *)((long)parser + 0x3d8);
        *(undefined8 **)((long)parser + 0x3d8) = puVar6;
        pcVar18 = s_local + (long)enc->minBytesPerChar * 2;
        iVar2 = (*enc->nameLength)(enc,pcVar18);
        if ((iVar2 != *(int *)(puVar6 + 2)) ||
           (iVar2 = bcmp((void *)puVar6[1],pcVar18,(long)iVar2), iVar2 != 0)) {
          *local_70 = pcVar18;
          return XML_ERROR_TAG_MISMATCH;
        }
        *(int *)((long)parser + 0x23c) = *(int *)((long)parser + 0x23c) + -1;
        pcVar5 = *(code **)((long)parser + 0x70);
        if ((pcVar5 == (code *)0x0) || (lVar11 = puVar6[3], lVar11 == 0)) {
          if (*(long *)((long)parser + 0xa0) != 0) {
            reportDefault(parser,enc,s_local,next);
          }
        }
        else {
          lVar19 = puVar6[4];
          if (lVar19 != 0) {
            iVar2 = *(int *)(puVar6 + 5);
            lVar4 = 0;
            do {
              cVar10 = *(char *)(lVar19 + lVar4);
              *(char *)(lVar11 + iVar2 + lVar4) = cVar10;
              lVar4 = lVar4 + 1;
            } while (cVar10 != '\0');
            pcVar5 = *(code **)((long)parser + 0x70);
            lVar11 = puVar6[3];
          }
          (*pcVar5)(*(undefined8 *)((long)parser + 8),lVar11);
        }
        plVar17 = (long *)puVar6[8];
        while (plVar17 != (long *)0x0) {
          plVar12 = plVar17;
          if (*(code **)((long)parser + 0xd0) != (code *)0x0) {
            (**(code **)((long)parser + 0xd0))
                      (*(undefined8 *)((long)parser + 8),*(undefined8 *)*plVar17);
            plVar12 = (long *)puVar6[8];
          }
          plVar12 = (long *)plVar12[1];
          puVar6[8] = plVar12;
          plVar17[1] = *(long *)((long)parser + 1000);
          *(long **)((long)parser + 1000) = plVar17;
          *(long *)(*plVar17 + 8) = plVar17[2];
          plVar17 = plVar12;
        }
        iVar2 = *(int *)((long)parser + 0x23c);
        puVar6 = local_80;
        puVar20 = local_70;
        goto joined_r0x0047e18b;
      }
      goto LAB_0047e8d1;
    case 6:
      pcVar5 = *(code **)((long)parser + 0x78);
      if (pcVar5 == (code *)0x0) goto switchD_0047db34_default;
      if (enc->isUtf8 != '\0') {
        uVar15 = *(undefined8 *)((long)parser + 8);
        iVar2 = (int)next - (int)s_local;
        ppXVar14 = (XML_Char **)s_local;
        goto LAB_0047df32;
      }
      while( true ) {
        toPtr = *(XML_Char **)((long)parser + 0x58);
        (*enc->utf8Convert)(enc,&s_local,next,&toPtr,*(char **)((long)parser + 0x60));
        *puVar6 = s_local;
        (**(code **)((long)parser + 0x78))
                  (*(undefined8 *)((long)parser + 8),*(undefined8 *)((long)parser + 0x58),
                   (int)toPtr - (int)*(undefined8 *)((long)parser + 0x58));
        if (s_local == next) break;
        *puVar20 = s_local;
      }
      break;
    case 7:
      pcVar5 = *(code **)((long)parser + 0x78);
      if (pcVar5 == (code *)0x0) goto switchD_0047db34_default;
      toPtr = (XML_Char *)CONCAT71(toPtr._1_7_,10);
      uVar15 = *(undefined8 *)((long)parser + 8);
      ppXVar14 = &toPtr;
LAB_0047df2f:
      iVar2 = 1;
LAB_0047df32:
      (*pcVar5)(uVar15,ppXVar14,iVar2);
      break;
    case 8:
      if (*(code **)((long)parser + 0x90) == (code *)0x0) {
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,s_local,next);
        }
      }
      else {
        (**(code **)((long)parser + 0x90))(*(undefined8 *)((long)parser + 8));
      }
      XVar3 = doCdataSection(parser,enc,&next,local_a0,nextPtr);
      if (next == (char *)0x0) {
        *(code **)((long)parser + 0x208) = cdataSectionProcessor;
        return XVar3;
      }
      break;
    case 9:
      iVar2 = (*enc->predefinedEntityName)
                        (enc,s_local + enc->minBytesPerChar,next + -(long)enc->minBytesPerChar);
      fromPtr = (char *)CONCAT71(fromPtr._1_7_,(char)iVar2);
      if ((char)iVar2 != '\0') {
        pcVar5 = *(code **)((long)parser + 0x78);
        if (pcVar5 != (code *)0x0) {
          uVar15 = *(undefined8 *)((long)parser + 8);
          ppXVar14 = &fromPtr;
          goto LAB_0047df2f;
        }
LAB_0047e32c:
        lVar11 = *(long *)((long)parser + 0xa0);
        goto joined_r0x0047e334;
      }
      name = poolStoreString(local_38,enc,s_local + enc->minBytesPerChar,
                             next + -(long)enc->minBytesPerChar);
      if (name == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pNVar7 = lookup(local_40,name,0);
      *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
      if (pNVar7 == (NAMED *)0x0) {
        if ((*(int *)((long)parser + 0x360) != 0) || (*(int *)((long)parser + 0x364) != 0)) {
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        goto LAB_0047e32c;
      }
      if (*(char *)&pNVar7[7].name != '\0') {
        return XML_ERROR_RECURSIVE_ENTITY_REF;
      }
      if (pNVar7[6].name != (KEY)0x0) {
        return XML_ERROR_BINARY_ENTITY_REF;
      }
      pcVar18 = pNVar7[1].name;
      local_88 = pNVar7;
      if (pcVar18 == (char *)0x0) {
        if (*(long *)((long)parser + 0xe0) == 0) goto LAB_0047e32c;
        *(undefined1 *)&pNVar7[7].name = 1;
        bVar22 = *(long *)((long)parser + 0x398) == 0;
        uVar21 = CONCAT71((int7)((ulong)puVar20 >> 8),bVar22);
        if (!bVar22) {
          puVar9 = *(undefined1 **)((long)parser + 0x430);
          if (puVar9 == *(undefined1 **)((long)parser + 0x428)) {
            iVar2 = poolGrow(local_98);
            if (iVar2 == 0) goto LAB_0047e7fd;
            puVar9 = *(undefined1 **)((long)parser + 0x430);
          }
          *(undefined1 **)((long)parser + 0x430) = puVar9 + 1;
          *puVar9 = 0x3d;
          uVar16 = *(int *)(*(long *)((long)parser + 0x398) + 0x28) + -1 +
                   (uint)(*(char *)((long)parser + 0x488) == '\0');
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
            puVar9 = *(undefined1 **)((long)parser + 0x430);
            if (puVar9 == *(undefined1 **)((long)parser + 0x428)) {
              iVar2 = poolGrow(local_98);
              if (iVar2 == 0) goto LAB_0047e7fd;
              puVar9 = *(undefined1 **)((long)parser + 0x430);
            }
            uVar1 = *(undefined1 *)(*(long *)(*(long *)((long)parser + 0x398) + 0x20) + uVar13);
            *(undefined1 **)((long)parser + 0x430) = puVar9 + 1;
            *puVar9 = uVar1;
          }
        }
        toPtr = *(XML_Char **)((long)parser + 0x308);
        ppNStack_60 = (NAMED **)(toPtr + *(long *)((long)parser + 0x310) * 8);
        while( true ) {
          pNVar7 = hashTableIterNext((HASH_TABLE_ITER *)&toPtr);
          if (pNVar7 == (NAMED *)0x0) break;
          if (pNVar7[1].name != (KEY)0x0) {
            if ((uVar21 & 1) == 0) {
              puVar9 = *(undefined1 **)((long)parser + 0x430);
              if (puVar9 == *(undefined1 **)((long)parser + 0x428)) {
                iVar2 = poolGrow(local_98);
                if (iVar2 == 0) goto LAB_0047e7fd;
                puVar9 = *(undefined1 **)((long)parser + 0x430);
              }
              *(undefined1 **)((long)parser + 0x430) = puVar9 + 1;
              *puVar9 = 0xc;
            }
            pcVar18 = pNVar7->name;
            while( true ) {
              cVar10 = *pcVar18;
              pcVar8 = *(char **)((long)parser + 0x430);
              if (cVar10 == '\0') break;
              if (pcVar8 == *(char **)((long)parser + 0x428)) {
                iVar2 = poolGrow(local_98);
                if (iVar2 == 0) goto LAB_0047e7fd;
                cVar10 = *pcVar18;
                pcVar8 = *(char **)((long)parser + 0x430);
              }
              *(char **)((long)parser + 0x430) = pcVar8 + 1;
              *pcVar8 = cVar10;
              pcVar18 = pcVar18 + 1;
            }
            if (pcVar8 == *(char **)((long)parser + 0x428)) {
              iVar2 = poolGrow(local_98);
              if (iVar2 == 0) goto LAB_0047e7fd;
              pcVar8 = *(char **)((long)parser + 0x430);
            }
            *(char **)((long)parser + 0x430) = pcVar8 + 1;
            *pcVar8 = '=';
            uVar16 = *(int *)(pNVar7[1].name + 0x28) + -1 +
                     (uint)(*(char *)((long)parser + 0x488) == '\0');
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
              puVar9 = *(undefined1 **)((long)parser + 0x430);
              if (puVar9 == *(undefined1 **)((long)parser + 0x428)) {
                iVar2 = poolGrow(local_98);
                if (iVar2 == 0) goto LAB_0047e7fd;
                puVar9 = *(undefined1 **)((long)parser + 0x430);
              }
              uVar1 = *(undefined1 *)(*(long *)(pNVar7[1].name + 0x20) + uVar21);
              *(undefined1 **)((long)parser + 0x430) = puVar9 + 1;
              *puVar9 = uVar1;
            }
            uVar21 = 0;
          }
        }
        toPtr = *(XML_Char **)((long)parser + 0x290);
        ppNStack_60 = (NAMED **)(toPtr + *(long *)((long)parser + 0x298) * 8);
        local_44 = (uint)uVar21;
        while (pNVar7 = hashTableIterNext((HASH_TABLE_ITER *)&toPtr), pNVar7 != (NAMED *)0x0) {
          if (*(char *)&pNVar7[7].name != '\0') {
            if ((local_44 & 1) == 0) {
              puVar9 = *(undefined1 **)((long)parser + 0x430);
              if (puVar9 == *(undefined1 **)((long)parser + 0x428)) {
                iVar2 = poolGrow(local_98);
                if (iVar2 == 0) goto LAB_0047e7fd;
                puVar9 = *(undefined1 **)((long)parser + 0x430);
              }
              *(undefined1 **)((long)parser + 0x430) = puVar9 + 1;
              *puVar9 = 0xc;
            }
            for (pcVar18 = pNVar7->name; cVar10 = *pcVar18, cVar10 != '\0'; pcVar18 = pcVar18 + 1) {
              pcVar8 = *(char **)((long)parser + 0x430);
              if (pcVar8 == *(char **)((long)parser + 0x428)) {
                iVar2 = poolGrow(local_98);
                if (iVar2 == 0) goto LAB_0047e7fd;
                cVar10 = *pcVar18;
                pcVar8 = *(char **)((long)parser + 0x430);
              }
              *(char **)((long)parser + 0x430) = pcVar8 + 1;
              *pcVar8 = cVar10;
            }
            local_44 = 0;
          }
        }
        puVar9 = *(undefined1 **)((long)parser + 0x430);
        if (puVar9 == *(undefined1 **)((long)parser + 0x428)) {
          iVar2 = poolGrow(local_98);
          if (iVar2 == 0) {
LAB_0047e7fd:
            *(undefined1 *)&local_88[7].name = 0;
            return XML_ERROR_NO_MEMORY;
          }
          puVar9 = *(undefined1 **)((long)parser + 0x430);
        }
        *(undefined1 **)((long)parser + 0x430) = puVar9 + 1;
        *puVar9 = 0;
        lVar11 = *(long *)((long)parser + 0x438);
        *(undefined1 *)&local_88[7].name = 0;
        if (lVar11 == 0) {
          return XML_ERROR_NO_MEMORY;
        }
        iVar2 = (**(code **)((long)parser + 0xe0))
                          (*(undefined8 *)((long)parser + 0xe8),lVar11,local_88[4].name,
                           local_88[3].name);
        if (iVar2 == 0) {
          return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
        }
        *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
        puVar6 = local_80;
        puVar20 = local_70;
        break;
      }
      if ((*(long *)((long)parser + 0xa0) == 0) || (*(int *)((long)parser + 0x238) != 0)) {
        *(undefined1 *)&pNVar7[7].name = 1;
        local_58 = *(undefined8 *)((long)parser + 0x230);
        *(XML_Char ***)((long)parser + 0x230) = &toPtr;
        toPtr = (XML_Char *)0x0;
        ppNStack_60 = (NAMED **)0x0;
        local_50 = pNVar7;
        XVar3 = doContent(parser,*(int *)((long)parser + 0x23c),*(ENCODING **)((long)parser + 0x1b8)
                          ,pcVar18,pcVar18 + *(int *)&pNVar7[2].name,(char **)0x0);
        *(undefined1 *)&local_88[7].name = 0;
        *(undefined8 *)((long)parser + 0x230) = local_58;
        if (XVar3 != XML_ERROR_NONE) {
          return XVar3;
        }
        break;
      }
      goto LAB_0047e340;
    case 10:
      iVar2 = (*enc->charRefNumber)(enc,s_local);
      if (iVar2 < 0) {
        return XML_ERROR_BAD_CHAR_REF;
      }
      pcVar5 = *(code **)((long)parser + 0x78);
      if (pcVar5 == (code *)0x0) {
        lVar11 = *(long *)((long)parser + 0xa0);
        puVar20 = local_70;
        goto joined_r0x0047e334;
      }
      uVar15 = *(undefined8 *)((long)parser + 8);
      iVar2 = cm_expat_XmlUtf8Encode(iVar2,(char *)&toPtr);
      puVar6 = local_80;
      (*pcVar5)(uVar15,&toPtr,iVar2);
      puVar20 = local_70;
      break;
    case 0xb:
      iVar2 = reportProcessingInstruction(parser,enc,s_local,next);
      goto LAB_0047de52;
    case 0xc:
      return XML_ERROR_MISPLACED_XML_PI;
    case 0xd:
      iVar2 = reportComment(parser,enc,s_local,next);
LAB_0047de52:
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case -5:
      if (nextPtr == (char **)0x0) {
        if (*(code **)((long)parser + 0x78) == (code *)0x0) {
          if (*(long *)((long)parser + 0xa0) != 0) {
            reportDefault(parser,enc,s_local,local_a0);
          }
        }
        else if (enc->isUtf8 == '\0') {
          toPtr = *(XML_Char **)((long)parser + 0x58);
          (*enc->utf8Convert)(enc,&s_local,local_a0,&toPtr,*(char **)((long)parser + 0x60));
          (**(code **)((long)parser + 0x78))
                    (*(undefined8 *)((long)parser + 8),*(undefined8 *)((long)parser + 0x58),
                     (int)toPtr - (int)*(undefined8 *)((long)parser + 0x58));
        }
        else {
          (**(code **)((long)parser + 0x78))
                    (*(undefined8 *)((long)parser + 8),s_local,(int)local_a0 - (int)s_local);
        }
        if (local_8c == 0) {
          *puVar20 = local_a0;
LAB_0047e8e0:
          XVar3 = XML_ERROR_NO_ELEMENTS;
        }
        else {
          XVar3 = XML_ERROR_NONE;
          if (*(int *)((long)parser + 0x23c) != local_8c) {
            *puVar20 = local_a0;
LAB_0047e8d1:
            XVar3 = XML_ERROR_ASYNC_ENTITY;
          }
        }
      }
      else {
LAB_0047e7d8:
        *nextPtr = s_local;
        XVar3 = XML_ERROR_NONE;
      }
      return XVar3;
    case -4:
      if (nextPtr != (char **)0x0) goto LAB_0047e7d8;
      if (0 < local_8c) goto LAB_0047e86e;
      goto LAB_0047e8e0;
    case -3:
      if (nextPtr != (char **)0x0) goto LAB_0047e7d8;
      *puVar6 = local_a0;
      if (*(code **)((long)parser + 0x78) == (code *)0x0) {
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,s_local,local_a0);
        }
      }
      else {
        toPtr = (XML_Char *)CONCAT71(toPtr._1_7_,10);
        (**(code **)((long)parser + 0x78))(*(undefined8 *)((long)parser + 8),&toPtr,1);
      }
      if (local_8c != 0) {
LAB_0047e86e:
        if (*(int *)((long)parser + 0x23c) != local_8c) {
          return XML_ERROR_ASYNC_ENTITY;
        }
        return XML_ERROR_NONE;
      }
      goto LAB_0047e8e0;
    case -2:
      if (nextPtr == (char **)0x0) {
        return XML_ERROR_PARTIAL_CHAR;
      }
      goto LAB_0047e7d8;
    case -1:
      if (nextPtr == (char **)0x0) {
        return XML_ERROR_UNCLOSED_TOKEN;
      }
      goto LAB_0047e7d8;
    default:
switchD_0047db34_default:
      lVar11 = *(long *)((long)parser + 0xa0);
      goto joined_r0x0047e334;
    }
    s_local = next;
    *puVar20 = next;
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr)
{
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (characterDataHandler)
            characterDataHandler(handlerArg, &ch, 1);
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd.pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.generalEntities, name, 0);
        poolDiscard(&dtd.pool);
        if (!entity) {
          if (dtd.complete || dtd.standalone)
            return XML_ERROR_UNDEFINED_ENTITY;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity) {
          if (entity->textPtr) {
            enum XML_Error result;
            OPEN_INTERNAL_ENTITY openEntity;
            if (defaultHandler && !defaultExpandInternalEntities) {
              reportDefault(parser, enc, s, next);
              break;
            }
            entity->open = 1;
            openEntity.next = openInternalEntities;
            openInternalEntities = &openEntity;
            openEntity.entity = entity;
            openEntity.internalEventPtr = 0;
            openEntity.internalEventEndPtr = 0;
            result = doContent(parser,
                               tagLevel,
                               internalEncoding,
                               (char *)entity->textPtr,
                               (char *)(entity->textPtr + entity->textLen),
                               0);
            entity->open = 0;
            openInternalEntities = openEntity.next;
            if (result)
              return result;
          }
          else if (externalEntityRefHandler) {
            const XML_Char *context;
            entity->open = 1;
            context = getContext(parser);
            entity->open = 0;
            if (!context)
              return XML_ERROR_NO_MEMORY;
            if (!externalEntityRefHandler(externalEntityRefHandlerArg,
                                          context,
                                          entity->base,
                                          entity->systemId,
                                          entity->publicId))
              return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
            poolDiscard(&tempPool);
          }
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_START_TAG_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_START_TAG_NO_ATTS:
      {
        TAG *tag;
        if (freeTagList) {
          tag = freeTagList;
          freeTagList = freeTagList->parent;
        }
        else {
          tag = MALLOC(sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = MALLOC(INIT_TAG_BUF_SIZE);
          if (!tag->buf)
            return XML_ERROR_NO_MEMORY;
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = 0;
        tag->parent = tagStack;
        tagStack = tag;
        tag->name.localPart = 0;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        if (nextPtr) {
          /* Need to guarantee that:
             tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)) <= tag->bufEnd - sizeof(XML_Char) */
          if (tag->rawNameLength + (int)(sizeof(XML_Char) - 1) + (int)sizeof(XML_Char) > tag->bufEnd - tag->buf) {
            int bufSize = tag->rawNameLength * 4;
            bufSize = ROUND_UP(bufSize, sizeof(XML_Char));
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
          }
          memcpy(tag->buf, tag->rawName, tag->rawNameLength);
          tag->rawName = tag->buf;
        }
        ++tagLevel;
        if (startElementHandler) {
          enum XML_Error result;
          XML_Char *toPtr;
          for (;;) {
            const char *rawNameEnd = tag->rawName + tag->rawNameLength;
            const char *fromPtr = tag->rawName;
            int bufSize;
            if (nextPtr)
              toPtr = (XML_Char *)(tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)));
            else
              toPtr = (XML_Char *)tag->buf;
            tag->name.str = toPtr;
            XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            if (fromPtr == rawNameEnd)
              break;
            bufSize = (tag->bufEnd - tag->buf) << 1;
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
            if (nextPtr)
              tag->rawName = tag->buf;
          }
          *toPtr = XML_T('\0');
          result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
          if (result)
            return result;
          startElementHandler(handlerArg, tag->name.str, (const XML_Char **)atts);
          poolClear(&tempPool);
        }
        else {
          tag->name.str = 0;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      if (startElementHandler || endElementHandler) {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = 0;
        TAG_NAME name;
        name.str = poolStoreString(&tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result)
          return result;
        poolFinish(&tempPool);
        if (startElementHandler)
          startElementHandler(handlerArg, name.str, (const XML_Char **)atts);
        if (endElementHandler) {
          if (startElementHandler)
            *eventPP = *eventEndPP;
          endElementHandler(handlerArg, name.str);
        }
        poolClear(&tempPool);
        while (bindings) {
          BINDING *b = bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          bindings = bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      if (tagLevel == 0)
        return epilogProcessor(parser, next, end, nextPtr);
      break;
    case XML_TOK_END_TAG:
      if (tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = tagStack;
        tagStack = tag->parent;
        tag->parent = freeTagList;
        freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --tagLevel;
        if (endElementHandler && tag->name.str) {
          if (tag->name.localPart) {
            XML_Char *to = (XML_Char *)tag->name.str + tag->name.uriLen;
            const XML_Char *from = tag->name.localPart;
            while ((*to++ = *from++) != 0)
              ;
          }
          endElementHandler(handlerArg, tag->name.str);
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          characterDataHandler(handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (startCdataSectionHandler)
          startCdataSectionHandler(handlerArg);
#if 0
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the transformation
           and writes the characters out escaping them as necessary.  This case
           will fail to work if we leave out the following two lines (because &
           and < inside CDATA sections will be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this. */

        else if (characterDataHandler)
          characterDataHandler(handlerArg, dataBuf, 0);
#endif
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr);
        if (!next) {
          processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)dataBufEnd);
          characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)end - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)dataBuf;
            XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
            *eventEndPP = s;
            characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
            if (s == next)
              break;
            *eventPP = s;
          }
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)next - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    }
    *eventPP = s = next;
  }
  /* not reached */
}